

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

void fix(int at,int with)

{
  int iVar1;
  instrStruct *piVar2;
  
  iVar1 = 0;
  if (0 < at) {
    iVar1 = at;
  }
  iVar1 = iVar1 + 1;
  piVar2 = firstInstr;
  do {
    piVar2 = piVar2->next;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  piVar2->instr = with % bigNum + (piVar2->instr - piVar2->instr % bigNum);
  return;
}

Assistant:

instrStruct *getInstruction(int pos) {
	variable struct instrStruct *element;
	variable int i;
	i=0;
	element = firstInstr->next;
	while (i < pos) {
		element = element->next;
		i = i + 1;
	}
	return element;
}